

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O1

int slu_mmdnum_(int *neqns,int *perm,int *invp,shortint *qsize)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  
  uVar1 = *neqns;
  if (0 < (int)uVar1) {
    uVar4 = 0;
    do {
      if (qsize[uVar4] < 1) {
        perm[uVar4] = invp[uVar4];
      }
      else {
        perm[uVar4] = -invp[uVar4];
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  uVar1 = *neqns;
  if (0 < (int)uVar1) {
    uVar4 = 1;
    do {
      if (perm[uVar4 - 1] < 1) {
        uVar8 = uVar4 & 0xffffffff;
        do {
          iVar7 = (int)uVar8;
          uVar2 = perm[(long)iVar7 + -1];
          uVar8 = (ulong)-uVar2;
        } while ((int)uVar2 < 1);
        invp[uVar4 - 1] = ~uVar2;
        perm[(long)iVar7 + -1] = uVar2 + 1;
        iVar5 = perm[uVar4 - 1];
        if (iVar5 < 0) {
          piVar6 = perm + (uVar4 - 1);
          do {
            *piVar6 = -iVar7;
            piVar6 = perm + ((ulong)(uint)-iVar5 - 1);
            iVar5 = *piVar6;
          } while (iVar5 < 0);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (ulong)uVar1 + 1);
  }
  uVar1 = *neqns;
  if (0 < (int)uVar1) {
    lVar3 = 1;
    do {
      iVar7 = invp[lVar3 + -1];
      invp[lVar3 + -1] = -iVar7;
      perm[-1 - (long)iVar7] = (int)lVar3;
      lVar3 = lVar3 + 1;
    } while ((ulong)uVar1 + 1 != lVar3);
  }
  return 0;
}

Assistant:

int slu_mmdnum_(const int *neqns, int *perm, int *invp, shortint *qsize)
{
    /* System generated locals */

    int i__1;

    /* Local variables */
    int_t node, root, nextf, father, nqsize, num;


/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --qsize;
    --invp;
    --perm;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	nqsize = qsize[node];
	if (nqsize <= 0) {
	    perm[node] = invp[node];
	}
	if (nqsize > 0) {
	    perm[node] = -invp[node];
	}
/* L100: */
    }
/*        ------------------------------------------------------ */
/*        FOR EACH NODE WHICH HAS BEEN MERGED, DO THE FOLLOWING. */
/*        ------------------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	if (perm[node] > 0) {
	    goto L500;
	}
/*                ----------------------------------------- */
/*                TRACE THE MERGED TREE UNTIL ONE WHICH HAS */
/*                NOT BEEN MERGED, CALL IT ROOT. */
/*                ----------------------------------------- */
	father = node;
L200:
	if (perm[father] > 0) {
	    goto L300;
	}
	father = -perm[father];
	goto L200;
L300:
/*                ----------------------- */
/*                NUMBER NODE AFTER ROOT. */
/*                ----------------------- */
	root = father;
	num = perm[root] + 1;
	invp[node] = -num;
	perm[root] = num;
/*                ------------------------ */
/*                SHORTEN THE MERGED TREE. */
/*                ------------------------ */
	father = node;
L400:
	nextf = -perm[father];
	if (nextf <= 0) {
	    goto L500;
	}
	perm[father] = -root;
	father = nextf;
	goto L400;
L500:
	;
    }
/*        ---------------------- */
/*        READY TO COMPUTE PERM. */
/*        ---------------------- */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	num = -invp[node];
	invp[node] = num;
	perm[num] = node;
/* L600: */
    }
    return 0;

}